

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_RunLength.cc
# Opt level: O0

void __thiscall Pl_RunLength::flush_encode(Pl_RunLength *this)

{
  pointer pMVar1;
  logic_error *this_00;
  Pipeline *pPVar2;
  pointer pMVar3;
  int local_2c;
  char local_1e;
  char local_1d [7];
  uchar ch_1;
  uchar ch;
  Pl_RunLength *local_10;
  Pl_RunLength *this_local;
  
  local_10 = this;
  pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
           operator->(&this->m);
  if (pMVar1->length == 0x80) {
    pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
             operator->(&this->m);
    if (pMVar1->state == st_copying) {
      local_2c = 0;
    }
    else {
      pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      local_2c = -1;
      if (pMVar1->state == st_run) {
        local_2c = 1;
      }
    }
    QTC::TC("libtests","Pl_RunLength flush full buffer",local_2c);
  }
  pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
           operator->(&this->m);
  if (pMVar1->length == 0) {
    QTC::TC("libtests","Pl_RunLength flush empty buffer",0);
  }
  pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
           operator->(&this->m);
  if (pMVar1->state == st_run) {
    pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
             operator->(&this->m);
    if ((pMVar1->length < 2) ||
       (pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>
                 ::operator->(&this->m), 0x80 < pMVar1->length)) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error(this_00,"Pl_RunLength: invalid length in flush_encode for run");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
             operator->(&this->m);
    local_1d[0] = '\x01' - (char)pMVar1->length;
    pPVar2 = Pipeline::next(&this->super_Pipeline);
    (*pPVar2->_vptr_Pipeline[2])(pPVar2,local_1d,1);
    pPVar2 = Pipeline::next(&this->super_Pipeline);
    pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
             operator->(&this->m);
    (*pPVar2->_vptr_Pipeline[2])(pPVar2,pMVar1->buf,1);
  }
  else {
    pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
             operator->(&this->m);
    if (pMVar1->length != 0) {
      pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      local_1e = (char)pMVar1->length + -1;
      pPVar2 = Pipeline::next(&this->super_Pipeline);
      (*pPVar2->_vptr_Pipeline[2])(pPVar2,&local_1e,1);
      pPVar2 = Pipeline::next(&this->super_Pipeline);
      pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      pMVar3 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
               operator->(&this->m);
      (*pPVar2->_vptr_Pipeline[2])(pPVar2,pMVar1->buf,(ulong)pMVar3->length);
    }
  }
  pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
           operator->(&this->m);
  pMVar1->state = st_top;
  pMVar1 = std::unique_ptr<Pl_RunLength::Members,_std::default_delete<Pl_RunLength::Members>_>::
           operator->(&this->m);
  pMVar1->length = 0;
  return;
}

Assistant:

void
Pl_RunLength::flush_encode()
{
    if (m->length == 128) {
        QTC::TC(
            "libtests",
            "Pl_RunLength flush full buffer",
            (m->state == st_copying   ? 0
                 : m->state == st_run ? 1
                                      : -1));
    }
    if (m->length == 0) {
        QTC::TC("libtests", "Pl_RunLength flush empty buffer");
    }
    if (m->state == st_run) {
        if ((m->length < 2) || (m->length > 128)) {
            throw std::logic_error("Pl_RunLength: invalid length in flush_encode for run");
        }
        auto ch = static_cast<unsigned char>(257 - m->length);
        next()->write(&ch, 1);
        next()->write(&m->buf[0], 1);
    } else if (m->length > 0) {
        auto ch = static_cast<unsigned char>(m->length - 1);
        next()->write(&ch, 1);
        next()->write(m->buf, m->length);
    }
    m->state = st_top;
    m->length = 0;
}